

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O0

p_ply_element ply_grow_element(p_ply ply)

{
  p_ply_element element_00;
  long in_RDI;
  p_ply_element element;
  long *in_stack_fffffffffffffff8;
  
  element_00 = (p_ply_element)ply_grow_array(ply,(void **)element,in_stack_fffffffffffffff8,in_RDI);
  if (element_00 == (p_ply_element)0x0) {
    element_00 = (p_ply_element)0x0;
  }
  else {
    ply_element_init(element_00);
  }
  return element_00;
}

Assistant:

static p_ply_element ply_grow_element(p_ply ply) {
    p_ply_element element = NULL;
    assert(ply);
    assert(ply->element || ply->nelements == 0);
    assert(!ply->element || ply->nelements > 0);
    element = (p_ply_element)ply_grow_array(
        ply, (void **)&ply->element, &ply->nelements, sizeof(t_ply_element));
    if (!element) return NULL;
    ply_element_init(element);
    return element;
}